

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

bool __thiscall cmGlobalNinjaGenerator::OpenBuildFileStreams(cmGlobalNinjaGenerator *this)

{
  bool bVar1;
  ostream *poVar2;
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,NINJA_BUILD_FILE,&local_41)
  ;
  bVar1 = OpenFileStream(this,&this->BuildFileStream,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if (bVar1) {
    poVar2 = std::operator<<((ostream *)
                             (this->BuildFileStream)._M_t.
                             super___uniq_ptr_impl<cmGeneratedFileStream,_std::default_delete<cmGeneratedFileStream>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratedFileStream_*,_std::default_delete<cmGeneratedFileStream>_>
                             .super__Head_base<0UL,_cmGeneratedFileStream_*,_false>._M_head_impl,
                             "# This file contains all the build statements describing the\n");
    std::operator<<(poVar2,"# compilation DAG.\n\n");
  }
  return bVar1;
}

Assistant:

bool cmGlobalNinjaGenerator::OpenBuildFileStreams()
{
  if (!this->OpenFileStream(this->BuildFileStream,
                            cmGlobalNinjaGenerator::NINJA_BUILD_FILE)) {
    return false;
  }

  // Write a comment about this file.
  *this->BuildFileStream
    << "# This file contains all the build statements describing the\n"
    << "# compilation DAG.\n\n";

  return true;
}